

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

void __thiscall rw::MatFX::setBumpTexture(MatFX *this,Texture *t)

{
  uint32 uVar1;
  uint32 uVar2;
  Texture *this_00;
  long lVar3;
  long lVar4;
  Texture **ppTVar5;
  
  uVar1 = this->fx[0].type;
  uVar2 = this->fx[1].type;
  if (uVar2 == 1 || uVar1 == 1) {
    lVar4 = 0xffffffff;
    if (uVar2 == 1) {
      lVar4 = 1;
    }
    lVar3 = 0;
    if (uVar1 != 1) {
      lVar3 = lVar4;
    }
    ppTVar5 = &this->fx[lVar3].field_1.bump.tex;
    this_00 = *ppTVar5;
    if (this_00 != (Texture *)0x0) {
      Texture::destroy(this_00);
    }
    *ppTVar5 = t;
    if (t != (Texture *)0x0) {
      t->refCount = t->refCount + 1;
    }
  }
  return;
}

Assistant:

void
MatFX::setBumpTexture(Texture *t)
{
	int32 i = this->getEffectIndex(BUMPMAP);
	if(i >= 0){
		if(this->fx[i].bump.tex)
			this->fx[i].bump.tex->destroy();
		this->fx[i].bump.tex = t;
		if(t)
			t->addRef();
	}
}